

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O1

void ssh1_channel_try_eof(ssh1_channel *c)

{
  ssh1_connection_state *psVar1;
  PktOut *pPVar2;
  
  if (c->pending_eof == false) {
    __assert_fail("c->pending_eof",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection1.c"
                  ,0x1d9,"void ssh1_channel_try_eof(struct ssh1_channel *)");
  }
  if (c->halfopen != false) {
    return;
  }
  psVar1 = c->connlayer;
  c->pending_eof = false;
  pPVar2 = (*((psVar1->ppl).bpp)->vt->new_pktout)(0x18);
  BinarySink_put_uint32(pPVar2->binarysink_,(ulong)c->remoteid);
  pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar2->qnode);
  *(byte *)&c->closes = (byte)c->closes | 1;
  ssh1_channel_check_close(c);
  return;
}

Assistant:

static void ssh1_channel_try_eof(struct ssh1_channel *c)
{
    struct ssh1_connection_state *s = c->connlayer;
    PktOut *pktout;
    assert(c->pending_eof);          /* precondition for calling us */
    if (c->halfopen)
        return;                 /* can't close: not even opened yet */

    c->pending_eof = false;            /* we're about to send it */

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE);
    put_uint32(pktout, c->remoteid);
    pq_push(s->ppl.out_pq, pktout);
    c->closes |= CLOSES_SENT_CLOSE;

    ssh1_channel_check_close(c);
}